

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandInvCheck(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  char *pcVar8;
  uint local_3c;
  int fVerbose;
  int nFailed;
  int c;
  abctime clk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  aVar5 = Abc_Clock();
  local_3c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(1,"Abc_CommandInvMin(): There is no current design.\n");
      }
      else {
        pVVar6 = Wlc_AbcGetInv(pAbc);
        if (pVVar6 == (Vec_Int_t *)0x0) {
          Abc_Print(1,"Abc_CommandInvMin(): There is no saved invariant.\n");
        }
        else {
          iVar1 = Gia_ManRegNum(pAbc->pGia);
          pVVar6 = Wlc_AbcGetInv(pAbc);
          iVar2 = Vec_IntEntryLast(pVVar6);
          if (iVar1 == iVar2) {
            p = pAbc->pGia;
            pVVar6 = Wlc_AbcGetInv(pAbc);
            uVar3 = Pdr_InvCheck(p,pVVar6,local_3c);
            if (uVar3 == 0) {
              printf("Invariant verification succeeded.    ");
            }
            else {
              pVVar6 = Wlc_AbcGetInv(pAbc);
              uVar4 = Vec_IntEntry(pVVar6,0);
              printf("Invariant verification failed for %d clauses (out of %d). ",(ulong)uVar3,
                     (ulong)uVar4);
            }
            aVar7 = Abc_Clock();
            Abc_PrintTime(1,"Time",aVar7 - aVar5);
          }
          else {
            Abc_Print(1,
                      "Abc_CommandInvMin(): The number of flops in the invariant and in GIA should be the same.\n"
                     );
          }
        }
      }
      return 0;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    local_3c = local_3c ^ 1;
  }
  Abc_Print(-2,"usage: inv_check [-vh]\n");
  Abc_Print(-2,"\t         checks that the invariant is indeed an inductive invariant\n");
  Abc_Print(-2,"\t         (AIG representing the design should be in the &-space)\n");
  pcVar8 = "no";
  if (local_3c != 0) {
    pcVar8 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandInvCheck( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    abctime clk = Abc_Clock();
    extern int Pdr_InvCheck( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose );
    int c, nFailed, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): There is no current design.\n" );
        return 0;
    }
    if ( Wlc_AbcGetInv(pAbc) == NULL )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): There is no saved invariant.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) != Vec_IntEntryLast(Wlc_AbcGetInv(pAbc)) )
    {
        Abc_Print( 1, "Abc_CommandInvMin(): The number of flops in the invariant and in GIA should be the same.\n" );
        return 0;
    }
    nFailed = Pdr_InvCheck( pAbc->pGia, Wlc_AbcGetInv(pAbc), fVerbose );
    if ( nFailed )
        printf( "Invariant verification failed for %d clauses (out of %d). ", nFailed, Vec_IntEntry(Wlc_AbcGetInv(pAbc),0) );
    else
        printf( "Invariant verification succeeded.    " );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;
usage:
    Abc_Print( -2, "usage: inv_check [-vh]\n" );
    Abc_Print( -2, "\t         checks that the invariant is indeed an inductive invariant\n" );
    Abc_Print( -2, "\t         (AIG representing the design should be in the &-space)\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}